

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O3

bool __thiscall QUrlModel::setData(QUrlModel *this,QModelIndex *index,QVariant *value,int role)

{
  QFileSystemModel *pQVar1;
  undefined1 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  QUrl url;
  QArrayData *local_c8;
  QArrayData *local_b0 [3];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QUrl local_80;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = ::QVariant::typeId(value);
  if (iVar3 != 0x11) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar2 = QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)value);
      return (bool)uVar2;
    }
    goto LAB_004f5d57;
  }
  local_80.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toUrl();
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->fileSystemModel;
  QUrl::toLocalFile();
  QFileSystemModel::index((QString *)&local_98,(int)pQVar1);
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  if (this->showFullPath == true) {
    (**(code **)(*(long *)this->fileSystemModel + 0x90))
              (&local_78,this->fileSystemModel,&local_98,0x101);
    ::QVariant::toString();
    QDir::toNativeSeparators((QString *)local_b0);
    ::QVariant::QVariant((QVariant *)&local_58,(QString *)local_b0);
    QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (local_b0[0] != (QArrayData *)0x0) {
      LOCK();
      (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0[0],2,0x10);
      }
    }
    if (local_c8 != (QArrayData *)0x0) {
      LOCK();
      (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar3 = (local_c8->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      local_b0[0] = local_c8;
joined_r0x004f5c9e:
      if (iVar3 == 0) {
        QArrayData::deallocate(local_b0[0],2,0x10);
      }
    }
  }
  else {
    (**(code **)(*(long *)this->fileSystemModel + 0x90))
              (&local_78,this->fileSystemModel,&local_98,0x101);
    ::QVariant::toString();
    QDir::toNativeSeparators((QString *)local_b0);
    ::QVariant::QVariant((QVariant *)&local_58,(QString *)local_b0);
    QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (local_b0[0] != (QArrayData *)0x0) {
      LOCK();
      (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0[0],2,0x10);
      }
    }
    if (local_c8 != (QArrayData *)0x0) {
      LOCK();
      (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_c8,2,0x10);
      }
    }
    ::QVariant::~QVariant(&local_78);
    (**(code **)(*(long *)this->fileSystemModel + 0x90))
              (&local_78,this->fileSystemModel,&local_98,0);
    ::QVariant::toString();
    ::QVariant::QVariant((QVariant *)&local_58,(QString *)local_b0);
    QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (local_b0[0] != (QArrayData *)0x0) {
      LOCK();
      (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar3 = (local_b0[0]->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      goto joined_r0x004f5c9e;
    }
  }
  ::QVariant::~QVariant(&local_78);
  (**(code **)(*(long *)this->fileSystemModel + 0x90))(&local_58,this->fileSystemModel,&local_98,1);
  QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  ::QVariant::QVariant((QVariant *)&local_58,&local_80);
  QStandardItemModel::setData((QModelIndex *)this,(QVariant *)index,(int)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QUrl::~QUrl(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
LAB_004f5d57:
  __stack_chk_fail();
}

Assistant:

bool QUrlModel::setData(const QModelIndex &index, const QVariant &value, int role)
{
    if (value.userType() == QMetaType::QUrl) {
        QUrl url = value.toUrl();
        QModelIndex dirIndex = fileSystemModel->index(url.toLocalFile());
        //On windows the popup display the "C:\", convert to nativeSeparators
        if (showFullPath)
            QStandardItemModel::setData(index, QDir::toNativeSeparators(fileSystemModel->data(dirIndex, QFileSystemModel::FilePathRole).toString()));
        else {
            QStandardItemModel::setData(index, QDir::toNativeSeparators(fileSystemModel->data(dirIndex, QFileSystemModel::FilePathRole).toString()), Qt::ToolTipRole);
            QStandardItemModel::setData(index, fileSystemModel->data(dirIndex).toString());
        }
        QStandardItemModel::setData(index, fileSystemModel->data(dirIndex, Qt::DecorationRole),
                                               Qt::DecorationRole);
        QStandardItemModel::setData(index, url, UrlRole);
        return true;
    }
    return QStandardItemModel::setData(index, value, role);
}